

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_monster_smell(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"smell");
    *(int *)((long)pvVar3 + 0x40) = ((uint)z_info->max_sight * wVar1) / 0x14;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_monster_smell(struct parser *p) {
	struct monster_race *r = parser_priv(p);

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	/* Assumes max_sight is 20, so we adjust in case it isn't */
	r->smell = parser_getint(p, "smell") * z_info->max_sight / 20;
	return PARSE_ERROR_NONE;
}